

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

QList<QAbstractButton_*> * __thiscall
QDialogButtonBoxPrivate::visibleButtons(QDialogButtonBoxPrivate *this)

{
  parameter_type t;
  qsizetype qVar1;
  long in_RSI;
  QList<QAbstractButton_*> *in_RDI;
  int j;
  QList<QAbstractButton_*> *list;
  int i;
  QList<QAbstractButton_*> *finalList;
  QList<QAbstractButton_*> *this_00;
  int local_24;
  int local_18;
  
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QAbstractButton_*>::QList((QList<QAbstractButton_*> *)0x66d853);
  for (local_18 = 0; local_18 < 9; local_18 = local_18 + 1) {
    local_24 = 0;
    while( true ) {
      t = (parameter_type)(long)local_24;
      qVar1 = QList<QAbstractButton_*>::size
                        ((QList<QAbstractButton_*> *)(in_RSI + 600 + (long)local_18 * 0x18));
      if (qVar1 <= (long)t) break;
      QList<QAbstractButton_*>::at(this_00,(qsizetype)t);
      QList<QAbstractButton_*>::append((QList<QAbstractButton_*> *)0x66d8d4,t);
      local_24 = local_24 + 1;
    }
  }
  return in_RDI;
}

Assistant:

QList<QAbstractButton *> QDialogButtonBoxPrivate::visibleButtons() const
{
    QList<QAbstractButton *> finalList;
    for (int i = 0; i < QDialogButtonBox::NRoles; ++i) {
        const QList<QAbstractButton *> &list = buttonLists[i];
        for (int j = 0; j < list.size(); ++j)
            finalList.append(list.at(j));
    }
    return finalList;
}